

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i x_convolve_4tap_4x2_ssse3(uint8_t *src,ptrdiff_t stride,__m128i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i *in_RDX;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  __m128i alVar3;
  __m128i ss [2];
  __m128i sfl1;
  __m128i sfl0;
  __m128i s;
  ptrdiff_t in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb4;
  undefined1 in_stack_fffffffffffffeb5;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  __m128i local_148;
  undefined1 local_138 [16];
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  __m128i *local_f0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined1 local_98;
  undefined1 local_97;
  undefined1 local_96;
  undefined1 local_95;
  undefined1 local_94;
  undefined1 local_93;
  undefined1 local_92;
  undefined1 local_91;
  undefined1 local_90;
  undefined1 local_8f;
  undefined1 local_8e;
  undefined1 local_8d;
  undefined1 local_8c;
  undefined1 local_8b;
  undefined1 local_8a;
  undefined1 local_89;
  undefined1 local_88;
  undefined1 local_87;
  undefined1 local_86;
  undefined1 local_85;
  undefined1 local_84;
  undefined1 local_83;
  undefined1 local_82;
  undefined1 local_81;
  undefined1 local_80;
  undefined1 local_7f;
  undefined1 local_7e;
  undefined1 local_7d;
  undefined1 local_7c;
  undefined1 local_7b;
  undefined1 local_7a;
  undefined1 local_79;
  undefined1 local_78 [16];
  undefined1 local_68;
  undefined1 local_67;
  undefined1 local_66;
  undefined1 local_65;
  undefined1 local_64;
  undefined1 local_63;
  undefined1 local_62;
  undefined1 local_61;
  undefined1 local_60;
  undefined1 local_5f;
  undefined1 local_5e;
  undefined1 local_5d;
  undefined1 local_5c;
  undefined1 local_5b;
  undefined1 local_5a;
  undefined1 local_59;
  undefined1 local_58 [16];
  undefined1 local_40;
  undefined1 local_3f;
  undefined1 local_3e;
  undefined1 local_3d;
  undefined1 local_3c;
  undefined1 local_3b;
  undefined1 local_3a;
  undefined1 local_39;
  undefined1 local_38;
  undefined1 local_37;
  undefined1 local_36;
  undefined1 local_35;
  undefined1 local_34;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  
  local_f0 = in_RDX;
  load_u8_8x2_sse2((uint8_t *)
                   CONCAT17(in_stack_fffffffffffffeb7,
                            CONCAT16(in_stack_fffffffffffffeb6,
                                     CONCAT15(in_stack_fffffffffffffeb5,
                                              CONCAT14(in_stack_fffffffffffffeb4,
                                                       in_stack_fffffffffffffeb0)))),
                   in_stack_fffffffffffffea8);
  local_79 = 0;
  local_7a = 1;
  local_7b = 1;
  local_7c = 2;
  local_7d = 2;
  local_7e = 3;
  local_7f = 3;
  local_80 = 4;
  local_81 = 8;
  local_82 = 9;
  local_83 = 9;
  local_84 = 10;
  local_85 = 10;
  local_86 = 0xb;
  local_87 = 0xb;
  local_88 = 0xc;
  local_59 = 0xc;
  local_5a = 0xb;
  local_5b = 0xb;
  local_5c = 10;
  local_5d = 10;
  local_5e = 9;
  local_5f = 9;
  local_60 = 8;
  local_61 = 4;
  local_62 = 3;
  local_63 = 3;
  local_64 = 2;
  local_65 = 2;
  local_66 = 1;
  local_67 = 1;
  local_68 = 0;
  auVar1 = vpinsrb_avx(ZEXT116(0),1,1);
  auVar1 = vpinsrb_avx(auVar1,1,2);
  auVar1 = vpinsrb_avx(auVar1,2,3);
  auVar1 = vpinsrb_avx(auVar1,2,4);
  auVar1 = vpinsrb_avx(auVar1,3,5);
  auVar1 = vpinsrb_avx(auVar1,3,6);
  auVar1 = vpinsrb_avx(auVar1,4,7);
  auVar1 = vpinsrb_avx(auVar1,8,8);
  auVar1 = vpinsrb_avx(auVar1,9,9);
  auVar1 = vpinsrb_avx(auVar1,9,10);
  auVar1 = vpinsrb_avx(auVar1,10,0xb);
  auVar1 = vpinsrb_avx(auVar1,10,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xb,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xb,0xe);
  local_78 = vpinsrb_avx(auVar1,0xc,0xf);
  local_118 = local_78._0_8_;
  uStack_110 = local_78._8_8_;
  local_89 = 2;
  local_8a = 3;
  local_8b = 3;
  local_8c = 4;
  local_8d = 4;
  local_8e = 5;
  local_8f = 5;
  local_90 = 6;
  local_91 = 10;
  local_92 = 0xb;
  local_93 = 0xb;
  local_94 = 0xc;
  local_95 = 0xc;
  local_96 = 0xd;
  local_97 = 0xd;
  local_98 = 0xe;
  local_31 = 0xe;
  local_32 = 0xd;
  local_33 = 0xd;
  local_34 = 0xc;
  local_35 = 0xc;
  local_36 = 0xb;
  local_37 = 0xb;
  local_38 = 10;
  local_39 = 6;
  local_3a = 5;
  local_3b = 5;
  local_3c = 4;
  local_3d = 4;
  local_3e = 3;
  local_3f = 3;
  local_40 = 2;
  auVar1 = vpinsrb_avx(ZEXT116(2),3,1);
  auVar1 = vpinsrb_avx(auVar1,3,2);
  auVar1 = vpinsrb_avx(auVar1,4,3);
  auVar1 = vpinsrb_avx(auVar1,4,4);
  auVar1 = vpinsrb_avx(auVar1,5,5);
  auVar1 = vpinsrb_avx(auVar1,5,6);
  auVar1 = vpinsrb_avx(auVar1,6,7);
  auVar1 = vpinsrb_avx(auVar1,10,8);
  auVar1 = vpinsrb_avx(auVar1,0xb,9);
  auVar1 = vpinsrb_avx(auVar1,0xb,10);
  auVar1 = vpinsrb_avx(auVar1,0xc,0xb);
  auVar1 = vpinsrb_avx(auVar1,0xc,0xc);
  auVar1 = vpinsrb_avx(auVar1,0xd,0xd);
  auVar1 = vpinsrb_avx(auVar1,0xd,0xe);
  local_58 = vpinsrb_avx(auVar1,0xe,0xf);
  local_128 = local_58._0_8_;
  uStack_120 = local_58._8_8_;
  local_b8 = local_78._0_8_;
  uStack_b0 = local_78._8_8_;
  auVar2._8_8_ = in_XMM0_Qb;
  auVar2._0_8_ = in_XMM0_Qa;
  local_148 = (__m128i)vpshufb_avx(auVar2,local_78);
  local_d8 = local_58._0_8_;
  uStack_d0 = local_58._8_8_;
  auVar1._8_8_ = in_XMM0_Qb;
  auVar1._0_8_ = in_XMM0_Qa;
  local_138 = vpshufb_avx(auVar1,local_58);
  alVar3 = convolve_4tap_ssse3(&local_148,local_f0);
  alVar3[0] = alVar3[0];
  alVar3[1] = alVar3[1];
  return alVar3;
}

Assistant:

static inline __m128i x_convolve_4tap_4x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[2]) {
  const __m128i s = load_u8_8x2_sse2(src, stride);
  const __m128i sfl0 =
      _mm_setr_epi8(0, 1, 1, 2, 2, 3, 3, 4, 8, 9, 9, 10, 10, 11, 11, 12);
  const __m128i sfl1 =
      _mm_setr_epi8(2, 3, 3, 4, 4, 5, 5, 6, 10, 11, 11, 12, 12, 13, 13, 14);
  __m128i ss[2];

  ss[0] = _mm_shuffle_epi8(s, sfl0);
  ss[1] = _mm_shuffle_epi8(s, sfl1);
  return convolve_4tap_ssse3(ss, coeffs);
}